

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sh_ptr.h
# Opt level: O0

void __thiscall ShPtr<HG::SessionImpl>::decref(ShPtr<HG::SessionImpl> *this)

{
  SessionImpl *this_00;
  SessionImpl *ptr;
  ShPtr<HG::SessionImpl> *this_local;
  
  if ((this->cblock != (ShPtrRep *)0x0) &&
     (this->cblock->refCount = this->cblock->refCount - 1, this->cblock->refCount == 0)) {
    this_00 = ShPtrRep::asType<HG::SessionImpl>(this->cblock);
    if (this_00 != (SessionImpl *)0x0) {
      HG::SessionImpl::~SessionImpl(this_00);
      operator_delete(this_00,0x18);
    }
    if (this->cblock != (ShPtrRep *)0x0) {
      operator_delete(this->cblock,0x10);
    }
    this->cblock = (ShPtrRep *)0x0;
  }
  return;
}

Assistant:

void decref() {
        if(cblock) {
            --cblock->refCount;
            if(cblock->refCount == 0) {
                T* ptr = cblock->asType<T>();
                delete ptr;
                delete cblock;
                cblock = 0;
            }
        }
    }